

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O3

void Amap_ManCutSaveStored(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint *puVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  Amap_Cut_t **ppAVar8;
  Amap_Lib_t *pAVar9;
  uint *puVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  Amap_Cut_t *pAVar15;
  
  if ((pNode->field_11).pData != (void *)0x0) {
    __assert_fail("pNode->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xb4,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  iVar3 = p->pPars->nCutsMax;
  lVar4 = (long)p->vTemp->nSize;
  if (lVar4 < 1) {
    iVar13 = 2;
    uVar14 = 1;
  }
  else {
    iVar13 = 2;
    uVar14 = 1;
    lVar12 = 0;
    do {
      for (pAVar15 = p->ppCutsTemp[p->vTemp->pArray[lVar12]]; pAVar15 != (Amap_Cut_t *)0x0;
          pAVar15 = *(Amap_Cut_t **)(pAVar15 + (ulong)((uint)*pAVar15 >> 0x11) + 1)) {
        uVar14 = uVar14 + 1;
        iVar1 = iVar13 + 1 + ((uint)*pAVar15 >> 0x11);
        if (iVar3 <= (int)uVar14) {
          iVar1 = iVar13;
        }
        iVar13 = iVar1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar4);
  }
  p->nBytesUsed = p->nBytesUsed + iVar13 * 4;
  puVar5 = (uint *)Aig_MmFlexEntryFetch(p->pMemCuts,iVar13 * 4);
  *puVar5 = 0x20000;
  puVar5[1] = *(uint *)pNode >> 2 & 0xfffffffe;
  puVar10 = puVar5 + 2;
  pVVar6 = p->vTemp;
  if (pVVar6->nSize < 1) {
    uVar11 = 1;
  }
  else {
    uVar11 = 1;
    lVar4 = 0;
    do {
      iVar1 = pVVar6->pArray[lVar4];
      ppAVar8 = p->ppCutsTemp;
      pAVar15 = ppAVar8[iVar1];
      if (pAVar15 != (Amap_Cut_t *)0x0) {
        do {
          uVar11 = uVar11 + 1;
          uVar7 = (ulong)((uint)*pAVar15 >> 0x11);
          if ((int)uVar11 < iVar3) {
            memcpy(puVar10,pAVar15,(ulong)(((uint)*pAVar15 >> 0x11) * 4 + 4));
            uVar7 = (ulong)((uint)*pAVar15 >> 0x11);
            puVar10 = puVar10 + uVar7 + 1;
          }
          pAVar15 = *(Amap_Cut_t **)(pAVar15 + uVar7 + 1);
        } while (pAVar15 != (Amap_Cut_t *)0x0);
        ppAVar8 = p->ppCutsTemp;
      }
      ppAVar8[iVar1] = (Amap_Cut_t *)0x0;
      lVar4 = lVar4 + 1;
      pVVar6 = p->vTemp;
    } while (lVar4 < pVVar6->nSize);
  }
  if (uVar14 != uVar11) {
    __assert_fail("nCuts == nCuts2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xda,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  if ((long)puVar10 - (long)puVar5 >> 2 != (long)iVar13) {
    __assert_fail("(int *)pNext - pBuffer == nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xdb,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  pVVar6->nSize = 0;
  Aig_MmFlexRestart(p->pMemTemp);
  pAVar9 = p->pLib;
  if (0 < pAVar9->nNodes) {
    lVar4 = 0;
    do {
      if (p->ppCutsTemp[lVar4] != (Amap_Cut_t *)0x0) {
        puts("Amap_ManCutSaveStored(): Error!");
        pAVar9 = p->pLib;
      }
      lVar4 = lVar4 + 1;
    } while (SBORROW8(lVar4,(long)pAVar9->nNodes * 2) != lVar4 + (long)pAVar9->nNodes * -2 < 0);
  }
  (pNode->field_11).pData = puVar5;
  uVar11 = iVar3 - 1;
  uVar2 = uVar11;
  if ((int)uVar14 < (int)uVar11) {
    uVar2 = uVar14;
  }
  pNode->nCuts = uVar2;
  if ((int)uVar14 < 0x100000) {
    if (iVar3 != 0 && 0 < (int)uVar2) {
      uVar14 = uVar2 - 1;
      if (uVar11 < uVar2 - 1) {
        uVar14 = uVar11;
      }
      iVar3 = uVar14 + 1;
      puVar10 = (uint *)0x0;
      do {
        if ((puVar10 != (uint *)0x0) && ((*puVar5 & 0xffff) < (uint)(ushort)*puVar10)) {
          __assert_fail("pCut == NULL || pCut->iMat <= pNext->iMat",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                        ,0xee,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
        }
        iVar3 = iVar3 + -1;
        puVar10 = puVar5;
        puVar5 = puVar5 + (ulong)(*puVar5 >> 0x11) + 1;
      } while (iVar3 != 0);
    }
    return;
  }
  __assert_fail("nCuts < (1<<20)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                ,0xe4,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

void Amap_ManCutSaveStored( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    int nMaxCuts = p->pPars->nCutsMax;
    int * pBuffer;
    Amap_Cut_t * pNext, * pCut;
    int i, nWords, Entry, nCuts, nCuts2;
    assert( pNode->pData == NULL );
    // count memory needed
    nCuts = 1;
    nWords = 2;
    Vec_IntForEachEntry( p->vTemp, Entry, i )
    {
        for ( pCut = p->ppCutsTemp[Entry]; pCut; pCut = *Amap_ManCutNextP(pCut) )
        {
            nCuts++;
            if ( nCuts < nMaxCuts )
                nWords += pCut->nFans + 1;
        }
    }
    p->nBytesUsed += 4*nWords;
    // allocate memory
    pBuffer = (int *)Aig_MmFlexEntryFetch( p->pMemCuts, 4*nWords );
    pNext = (Amap_Cut_t *)pBuffer;
    // add the first cut
    pNext->iMat  = 0; 
    pNext->fInv  = 0;
    pNext->nFans = 1;
    pNext->Fans[0] = Abc_Var2Lit(pNode->Id, 0);
    pNext  = (Amap_Cut_t *)(pBuffer + 2);
    // add other cuts
    nCuts2 = 1;
    Vec_IntForEachEntry( p->vTemp, Entry, i )
    {
        for ( pCut = p->ppCutsTemp[Entry]; pCut; pCut = *Amap_ManCutNextP(pCut) )
        {
            nCuts2++;
            if ( nCuts2 < nMaxCuts )
            {
                memcpy( pNext, pCut, sizeof(int) * (pCut->nFans + 1) );
                pNext = (Amap_Cut_t *)((int *)pNext + pCut->nFans + 1);
            }
        }
        p->ppCutsTemp[Entry] = NULL;
    }
    assert( nCuts == nCuts2 );
    assert( (int *)pNext - pBuffer == nWords );
    // restore the storage
    Vec_IntClear( p->vTemp );
    Aig_MmFlexRestart( p->pMemTemp );
    for ( i = 0; i < 2*p->pLib->nNodes; i++ )
        if ( p->ppCutsTemp[i] != NULL )
            printf( "Amap_ManCutSaveStored(): Error!\n" );
    pNode->pData = (Amap_Cut_t *)pBuffer;
    pNode->nCuts = Abc_MinInt( nCuts, nMaxCuts-1 );
    assert( nCuts < (1<<20) );
//    printf("%d ", nCuts );
    // verify cuts
    pCut = NULL;
    Amap_NodeForEachCut( pNode, pNext, i )
//        for ( i = 0, pNext = (Amap_Cut_t *)pNode->pData; i < (int)pNode->nCuts; 
//        i++, pNext = Amap_ManCutNext(pNext) )
    {
        if ( i == nMaxCuts )
            break;
        assert( pCut == NULL || pCut->iMat <= pNext->iMat );
        pCut = pNext;
    }
}